

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<float>
               (char *label_id,float *xs,float *ys1,float *ys2,int count,int offset,int stride)

{
  undefined1 local_70 [8];
  GetterXsYs<float> getter2;
  GetterXsYs<float> getter1;
  int offset_local;
  int count_local;
  float *ys2_local;
  float *ys1_local;
  float *xs_local;
  char *label_id_local;
  
  GetterXsYs<float>::GetterXsYs((GetterXsYs<float> *)&getter2.Stride,xs,ys1,count,offset,stride);
  GetterXsYs<float>::GetterXsYs((GetterXsYs<float> *)local_70,xs,ys2,count,offset,stride);
  PlotShadedEx<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYs<float>>
            (label_id,(GetterXsYs<float> *)&getter2.Stride,(GetterXsYs<float> *)local_70);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}